

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

Range<wchar_t> __thiscall
Centaurus::CharClass<wchar_t>::operator[](CharClass<wchar_t> *this,int index)

{
  ulong uVar1;
  ulong in_RDX;
  undefined4 in_register_00000034;
  Range<wchar_t> RVar2;
  Range<wchar_t> RVar3;
  
  if (-1 < (int)in_RDX) {
    uVar1 = in_RDX & 0xffffffff;
    in_RDX = *(ulong *)(CONCAT44(in_register_00000034,index) + 8);
    if (uVar1 < (ulong)((long)(*(long *)(CONCAT44(in_register_00000034,index) + 0x10) - in_RDX) >> 4
                       )) {
      this->_vptr_CharClass = (_func_int **)&PTR__Range_001965b0;
      (this->m_ranges).
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_start = *(pointer *)(in_RDX + 8 + uVar1 * 0x10);
      RVar2.m_start = (int)in_RDX;
      RVar2.m_end = (int)(in_RDX >> 0x20);
      RVar2._vptr_Range = (_func_int **)this;
      return RVar2;
    }
  }
  this->_vptr_CharClass = (_func_int **)&PTR__Range_001965b0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  RVar3.m_start = (int)in_RDX;
  RVar3.m_end = (int)(in_RDX >> 0x20);
  RVar3._vptr_Range = (_func_int **)this;
  return RVar3;
}

Assistant:

Range<TCHAR> operator[](int index) const
    {
        if (index >= 0 && index < m_ranges.size())
            return m_ranges[index];
        return Range<TCHAR>();
    }